

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFParser::parseRemainder(QPDFParser *this,bool content_stream)

{
  InputSource *__args;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *pmVar1;
  bool bVar2;
  token_type_e tVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  qpdf_offset_t qVar7;
  char *pcVar8;
  longlong lVar9;
  logic_error *this_00;
  mapped_type *pmVar10;
  size_type sVar11;
  size_type sVar12;
  reference pvVar13;
  byte in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  undefined7 in_register_00000031;
  QPDFParser *this_01;
  QPDFObjectHandle QVar15;
  bool local_5f1;
  bool local_4e1;
  shared_ptr<QPDFObject> local_428;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3f0 [8];
  string s;
  string *val;
  allocator<char> local_3b1;
  string local_3b0;
  longlong local_390;
  bool local_385;
  parser_state_e local_384;
  shared_ptr<QPDFObject> local_380;
  allocator<char> local_369;
  string local_368;
  shared_ptr<QPDFObject> local_348;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [8];
  shared_ptr<QPDFObject> object_1;
  key_type local_2f8;
  allocator<char> local_2d1;
  key_type local_2d0;
  QPDFObjectHandle local_2b0;
  byte local_29b;
  byte local_29a;
  allocator<char> local_299;
  key_type local_298;
  byte local_273;
  byte local_272;
  allocator<char> local_271;
  key_type local_270;
  byte local_24b;
  byte local_24a;
  allocator<char> local_249;
  key_type local_248;
  byte local_223;
  byte local_222;
  allocator<char> local_221;
  string local_220;
  byte local_1fb;
  byte local_1fa;
  allocator<char> local_1f9;
  key_type local_1f8;
  byte local_1d3;
  byte local_1d2;
  allocator<char> local_1d1;
  key_type local_1d0;
  shared_ptr<QPDFObject> local_1b0;
  QPDFObjectHandle local_1a0;
  allocator<char> local_189;
  string local_188;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *local_168;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *dict;
  shared_ptr<QPDFObject> local_150;
  allocator<char> local_139;
  string local_138;
  uint local_118;
  bool local_111;
  undefined1 local_110 [8];
  shared_ptr<QPDFObject> object;
  shared_ptr<QPDFObject> local_f0;
  allocator<char> local_d9;
  string local_d8;
  shared_ptr<QPDFObject> local_b8;
  shared_ptr<QPDFObject> local_a8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  shared_ptr<QPDFObject> local_48;
  int local_34;
  int local_30;
  int gen;
  int id;
  byte local_1a;
  byte local_19;
  bool b_contents;
  QPDFParser *pQStack_18;
  bool content_stream_local;
  QPDFParser *this_local;
  
  this_01 = (QPDFParser *)CONCAT71(in_register_00000031,content_stream);
  local_19 = in_DL & 1;
  this_01->bad_count = 0;
  local_1a = 0;
  pQStack_18 = this_01;
  this_local = this;
LAB_002f8521:
  do {
    bVar2 = ::qpdf::Tokenizer::nextToken
                      (this_01->tokenizer,this_01->input,this_01->object_description,0);
    if (!bVar2) {
      psVar6 = ::qpdf::Tokenizer::getErrorMessage_abi_cxx11_(this_01->tokenizer);
      warn(this_01,psVar6);
    }
    this_01->good_count = this_01->good_count + 1;
    if (this_01->int_count != 0) {
      tVar3 = ::qpdf::Tokenizer::getType(this_01->tokenizer);
      if (tVar3 == tt_integer) {
        iVar4 = this_01->int_count + 1;
        this_01->int_count = iVar4;
        if (2 < iVar4) {
          addInt(this_01,this_01->int_count);
        }
        qVar7 = InputSource::getLastOffset(this_01->input);
        this_01->last_offset_buffer[this_01->int_count % 2] = qVar7;
        ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        lVar9 = QUtil::string_to_ll(pcVar8);
        this_01->int_buffer[this_01->int_count % 2] = lVar9;
        goto LAB_002f8521;
      }
      if ((1 < this_01->int_count) &&
         (tVar3 = ::qpdf::Tokenizer::getType(this_01->tokenizer), tVar3 == tt_word)) {
        psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        bVar2 = std::operator==(psVar6,"R");
        if (bVar2) {
          if (this_01->context == (QPDF *)0x0) {
            QTC::TC("qpdf","QPDFParser indirect without context",0);
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      (this_00,
                       "QPDFParser::parse called without context on an object with indirect references"
                      );
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          local_30 = QIntC::to_int<long_long>(this_01->int_buffer + (this_01->int_count + -1) % 2);
          local_34 = QIntC::to_int<long_long>(this_01->int_buffer + this_01->int_count % 2);
          if (((local_30 < 1) || (local_34 < 0)) || (0xfffe < local_34)) {
            QTC::TC("qpdf","QPDFParser invalid objgen",0);
            addNull(this_01);
          }
          else {
            QPDF::ParseGuard::getObject
                      ((QPDF *)&local_48,(int)this_01->context,local_30,SUB41(local_34,0));
            add(this_01,&local_48);
            std::shared_ptr<QPDFObject>::~shared_ptr(&local_48);
          }
          this_01->int_count = 0;
          goto LAB_002f8521;
        }
      }
      if (0 < this_01->int_count) {
        if (1 < this_01->int_count) {
          addInt(this_01,this_01->int_count + -1);
        }
        addInt(this_01,this_01->int_count);
        this_01->int_count = 0;
      }
    }
    tVar3 = ::qpdf::Tokenizer::getType(this_01->tokenizer);
    switch(tVar3) {
    case tt_bad:
      QTC::TC("qpdf","QPDFParser bad token in parseRemainder",0);
      bVar2 = tooManyBadTokens(this_01);
      if (bVar2) {
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_b8);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_b8);
        _Var14._M_pi = extraout_RDX_01;
        goto LAB_002fa27e;
      }
      addNull(this_01);
      goto LAB_002f8521;
    case tt_array_close:
      if ((this_01->bad_count != 0) && (this_01->max_bad_count == 0)) {
        tooManyBadTokens(this_01);
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)this,
                   (shared_ptr<QPDFObject> *)
                   &object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<QPDFObject>::~shared_ptr
                  ((shared_ptr<QPDFObject> *)
                   &object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        _Var14._M_pi = extraout_RDX_03;
        goto LAB_002fa27e;
      }
      if (this_01->frame->state != st_array) {
        QTC::TC("qpdf","QPDFParser bad array close in parseRemainder",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"treating unexpected array close token as null",&local_139);
        warn(this_01,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        bVar2 = tooManyBadTokens(this_01);
        if (bVar2) {
          QPDFObject::create<QPDF_Null>();
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_150);
          std::shared_ptr<QPDFObject>::~shared_ptr(&local_150);
          _Var14._M_pi = extraout_RDX_05;
          goto LAB_002fa27e;
        }
        addNull(this_01);
        goto LAB_002f8521;
      }
      if (this_01->frame->null_count < 0x65) {
        QPDFObject::
        create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                  ((QPDFObject *)local_110,&this_01->frame->olist);
      }
      else {
        local_111 = true;
        QPDFObject::
        create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
                  ((QPDFObject *)local_110,&this_01->frame->olist,&local_111);
      }
      setDescription(this_01,(ObjectPtr *)local_110,this_01->frame->offset + -1);
      sVar12 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::size
                         (&this_01->stack);
      if (1 < sVar12) {
        std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::pop_back
                  (&this_01->stack);
        pvVar13 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::back
                            (&this_01->stack);
        this_01->frame = pvVar13;
        add(this_01,(shared_ptr<QPDFObject> *)local_110);
      }
      else {
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)this,(shared_ptr<QPDFObject> *)local_110);
      }
      local_118 = (uint)(1 >= sVar12);
      std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_110);
      _Var14._M_pi = extraout_RDX_04;
      break;
    case tt_array_open:
    case tt_dict_open:
      sVar12 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::size
                         (&this_01->stack);
      if (499 < sVar12) {
        QTC::TC("qpdf","QPDFParser too deep",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"ignoring excessively deeply nested data structure",
                   &local_369);
        warn(this_01,&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator(&local_369);
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_380);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_380);
        _Var14._M_pi = extraout_RDX_09;
        goto LAB_002fa27e;
      }
      local_1a = 0;
      __args = this_01->input;
      tVar3 = ::qpdf::Tokenizer::getType(this_01->tokenizer);
      local_384 = st_dictionary_key;
      if (tVar3 == tt_array_open) {
        local_384 = st_array;
      }
      std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
      emplace_back<InputSource&,QPDFParser::parser_state_e>
                ((vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
                 &this_01->stack,__args,&local_384);
      pvVar13 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::back
                          (&this_01->stack);
      this_01->frame = pvVar13;
      goto LAB_002f8521;
    case tt_brace_close:
    case tt_brace_open:
      QTC::TC("qpdf","QPDFParser bad brace in parseRemainder",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"treating unexpected brace token as null",&local_d9);
      warn(this_01,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      bVar2 = tooManyBadTokens(this_01);
      if (bVar2) {
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_f0);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_f0);
        _Var14._M_pi = extraout_RDX_02;
        goto LAB_002fa27e;
      }
      addNull(this_01);
      goto LAB_002f8521;
    case tt_dict_close:
      if ((this_01->bad_count != 0) && (this_01->max_bad_count == 0)) {
        tooManyBadTokens(this_01);
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(shared_ptr<QPDFObject> *)&dict)
        ;
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&dict);
        _Var14._M_pi = extraout_RDX_06;
        goto LAB_002fa27e;
      }
      if (1 < (int)this_01->frame->state) {
        QTC::TC("qpdf","QPDFParser bad dictionary close in parseRemainder",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"unexpected dictionary close token",&local_331);
        warn(this_01,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        bVar2 = tooManyBadTokens(this_01);
        if (bVar2) {
          QPDFObject::create<QPDF_Null>();
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_348);
          std::shared_ptr<QPDFObject>::~shared_ptr(&local_348);
          _Var14._M_pi = extraout_RDX_08;
          goto LAB_002fa27e;
        }
        addNull(this_01);
        goto LAB_002f8521;
      }
      local_168 = &this_01->frame->dict;
      if (this_01->frame->state == st_dictionary_value) {
        QTC::TC("qpdf","QPDFParser no val for last key",0);
        qVar7 = this_01->frame->offset;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,
                   "dictionary ended prematurely; using null as value for last key",&local_189);
        warn(this_01,qVar7,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle(&local_1a0,&local_1b0);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](local_168,&this_01->frame->key);
        QPDFObjectHandle::operator=(pmVar10,&local_1a0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_1b0);
      }
      bVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                        (&this_01->frame->olist);
      if (!bVar2) {
        fixMissingKeys(this_01);
      }
      uVar5 = std::__cxx11::string::empty();
      pmVar1 = local_168;
      local_1d2 = 0;
      local_1d3 = 0;
      local_1fa = 0;
      local_1fb = 0;
      local_222 = 0;
      local_223 = 0;
      local_24a = 0;
      local_24b = 0;
      local_272 = 0;
      local_273 = 0;
      local_29a = 0;
      local_29b = 0;
      local_4e1 = false;
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        local_1d2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"/Type",&local_1d1);
        local_1d3 = 1;
        sVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 ::count(pmVar1,&local_1d0);
        pmVar1 = local_168;
        local_4e1 = false;
        if (sVar11 != 0) {
          std::allocator<char>::allocator();
          local_1fa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"/Type",&local_1f9);
          local_1fb = 1;
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                    ::operator[](pmVar1,&local_1f8);
          std::allocator<char>::allocator();
          local_222 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"/Sig",&local_221)
          ;
          local_223 = 1;
          bVar2 = QPDFObjectHandle::isNameAndEquals(pmVar10,&local_220);
          pmVar1 = local_168;
          local_4e1 = false;
          if (bVar2) {
            std::allocator<char>::allocator();
            local_24a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_248,"/ByteRange",&local_249);
            local_24b = 1;
            sVar11 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     ::count(pmVar1,&local_248);
            pmVar1 = local_168;
            local_4e1 = false;
            if (sVar11 != 0) {
              std::allocator<char>::allocator();
              local_272 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_270,"/Contents",&local_271);
              local_273 = 1;
              sVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                       ::count(pmVar1,&local_270);
              pmVar1 = local_168;
              local_4e1 = false;
              if (sVar11 != 0) {
                std::allocator<char>::allocator();
                local_29a = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_298,"/Contents",&local_299);
                local_29b = 1;
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                          ::operator[](pmVar1,&local_298);
                local_4e1 = QPDFObjectHandle::isString(pmVar10);
              }
            }
          }
        }
      }
      if ((local_29b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_298);
      }
      if ((local_29a & 1) != 0) {
        std::allocator<char>::~allocator(&local_299);
      }
      if ((local_273 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_270);
      }
      if ((local_272 & 1) != 0) {
        std::allocator<char>::~allocator(&local_271);
      }
      if ((local_24b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_248);
      }
      if ((local_24a & 1) != 0) {
        std::allocator<char>::~allocator(&local_249);
      }
      if ((local_223 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_220);
      }
      if ((local_222 & 1) != 0) {
        std::allocator<char>::~allocator(&local_221);
      }
      if ((local_1fb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      if ((local_1fa & 1) != 0) {
        std::allocator<char>::~allocator(&local_1f9);
      }
      if ((local_1d3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      if ((local_1d2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_1d1);
      }
      if (local_4e1 != false) {
        QPDFObjectHandle::newString(&local_2b0,&this_01->frame->contents_string);
        pmVar1 = local_168;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"/Contents",&local_2d1);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](pmVar1,&local_2d0);
        QPDFObjectHandle::operator=(pmVar10,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
        pmVar1 = local_168;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"/Contents",
                   (allocator<char> *)
                   ((long)&object_1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](pmVar1,&local_2f8);
        QPDFObjectHandle::setParsedOffset(pmVar10,this_01->frame->contents_offset);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&object_1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
      }
      QPDFObject::
      create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>>
                ((QPDFObject *)local_310,local_168);
      setDescription(this_01,(ObjectPtr *)local_310,this_01->frame->offset + -2);
      sVar12 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::size
                         (&this_01->stack);
      if (1 < sVar12) {
        std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::pop_back
                  (&this_01->stack);
        pvVar13 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::back
                            (&this_01->stack);
        this_01->frame = pvVar13;
        add(this_01,(shared_ptr<QPDFObject> *)local_310);
      }
      else {
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)this,(shared_ptr<QPDFObject> *)local_310);
      }
      local_118 = (uint)(1 >= sVar12);
      std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_310);
      _Var14._M_pi = extraout_RDX_07;
      break;
    case tt_integer:
      if ((local_19 & 1) == 0) {
        qVar7 = InputSource::getLastOffset(this_01->input);
        this_01->last_offset_buffer[1] = qVar7;
        ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        lVar9 = QUtil::string_to_ll(pcVar8);
        this_01->int_buffer[1] = lVar9;
        this_01->int_count = 1;
      }
      else {
        ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        local_390 = QUtil::string_to_ll(pcVar8);
        addScalar<QPDF_Integer,long_long>(this_01,&local_390);
      }
      goto LAB_002f8521;
    case tt_name:
      if (this_01->frame->state == st_dictionary_key) {
        psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        std::__cxx11::string::operator=((string *)&this_01->frame->key,(string *)psVar6);
        this_01->frame->state = st_dictionary_value;
        local_5f1 = false;
        if (this_01->decrypter != (StringDecrypter *)0x0) {
          local_5f1 = std::operator==(&this_01->frame->key,"/Contents");
        }
        local_1a = local_5f1;
      }
      else {
        psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        addScalar<QPDF_Name,std::__cxx11::string_const&>(this_01,psVar6);
      }
      goto LAB_002f8521;
    case tt_real:
      psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
      addScalar<QPDF_Real,std::__cxx11::string_const&>(this_01,psVar6);
      goto LAB_002f8521;
    case tt_string:
      s.field_2._8_8_ = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
      if (this_01->decrypter == (StringDecrypter *)0x0) {
        addScalar<QPDF_String,std::__cxx11::string_const&>
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           s.field_2._8_8_);
      }
      else {
        if ((local_1a & 1) != 0) {
          std::__cxx11::string::operator=
                    ((string *)&this_01->frame->contents_string,(string *)s.field_2._8_8_);
          qVar7 = InputSource::getLastOffset(this_01->input);
          this_01->frame->contents_offset = qVar7;
          local_1a = 0;
        }
        std::__cxx11::string::string((string *)local_3f0,(string *)s.field_2._8_8_);
        (*this_01->decrypter->_vptr_StringDecrypter[2])(this_01->decrypter,(string *)local_3f0);
        addScalar<QPDF_String,std::__cxx11::string&>
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f0);
        std::__cxx11::string::~string((string *)local_3f0);
      }
      goto LAB_002f8521;
    case tt_null:
      addNull(this_01);
      goto LAB_002f8521;
    case tt_bool:
      psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
      local_385 = std::operator==(psVar6,"true");
      addScalar<QPDF_Bool,bool>(this_01,&local_385);
      goto LAB_002f8521;
    case tt_word:
      if ((local_19 & 1) == 0) {
        QTC::TC("qpdf","QPDFParser treat word as string in parseRemainder",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,"unknown token while reading object; treating as string",
                   &local_3b1);
        warn(this_01,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::allocator<char>::~allocator(&local_3b1);
        bVar2 = tooManyBadTokens(this_01);
        if (bVar2) {
          QPDFObject::create<QPDF_Null>();
          QPDFObjectHandle::QPDFObjectHandle
                    ((QPDFObjectHandle *)this,(shared_ptr<QPDFObject> *)&val);
          std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&val);
          _Var14._M_pi = extraout_RDX_10;
          goto LAB_002fa27e;
        }
        psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        addScalar<QPDF_String,std::__cxx11::string_const&>(this_01,psVar6);
      }
      else {
        psVar6 = ::qpdf::Tokenizer::getValue_abi_cxx11_(this_01->tokenizer);
        addScalar<QPDF_Operator,std::__cxx11::string_const&>(this_01,psVar6);
      }
      goto LAB_002f8521;
    case tt_eof:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"parse error while reading object",&local_69);
      warn(this_01,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      if ((local_19 & 1) == 0) {
        QTC::TC("qpdf","QPDFParser eof in parseRemainder",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"unexpected EOF",&local_91);
        warn(this_01,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_a8);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_a8);
        _Var14._M_pi = extraout_RDX_00;
      }
      else {
        memset(this,0,0x10);
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
        _Var14._M_pi = extraout_RDX;
      }
      goto LAB_002fa27e;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"treating unknown token type as null while reading object",
                 &local_411);
      warn(this_01,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      bVar2 = tooManyBadTokens(this_01);
      if (bVar2) {
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_428);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_428);
        _Var14._M_pi = extraout_RDX_11;
        goto LAB_002fa27e;
      }
      addNull(this_01);
      goto LAB_002f8521;
    }
    if (local_118 != 0) {
LAB_002fa27e:
      QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var14._M_pi;
      QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (QPDFObjectHandle)
             QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

QPDFObjectHandle
QPDFParser::parseRemainder(bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    bad_count = 0;
    bool b_contents = false;

    while (true) {
        if (!tokenizer.nextToken(input, object_description)) {
            warn(tokenizer.getErrorMessage());
        }
        ++good_count; // optimistically

        if (int_count != 0) {
            // Special handling of indirect references. Treat integer tokens as part of an indirect
            // reference until proven otherwise.
            if (tokenizer.getType() == QPDFTokenizer::tt_integer) {
                if (++int_count > 2) {
                    // Process the oldest buffered integer.
                    addInt(int_count);
                }
                last_offset_buffer[int_count % 2] = input.getLastOffset();
                int_buffer[int_count % 2] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                continue;

            } else if (
                int_count >= 2 && tokenizer.getType() == QPDFTokenizer::tt_word &&
                tokenizer.getValue() == "R") {
                if (context == nullptr) {
                    QTC::TC("qpdf", "QPDFParser indirect without context");
                    throw std::logic_error(
                        "QPDFParser::parse called without context on an object "
                        "with indirect references");
                }
                auto id = QIntC::to_int(int_buffer[(int_count - 1) % 2]);
                auto gen = QIntC::to_int(int_buffer[(int_count) % 2]);
                if (!(id < 1 || gen < 0 || gen >= 65535)) {
                    add(QPDF::ParseGuard::getObject(context, id, gen, parse_pdf));
                } else {
                    QTC::TC("qpdf", "QPDFParser invalid objgen");
                    addNull();
                }
                int_count = 0;
                continue;

            } else if (int_count > 0) {
                // Process the buffered integers before processing the current token.
                if (int_count > 1) {
                    addInt(int_count - 1);
                }
                addInt(int_count);
                int_count = 0;
            }
        }

        switch (tokenizer.getType()) {
        case QPDFTokenizer::tt_eof:
            warn("parse error while reading object");
            if (content_stream) {
                // In content stream mode, leave object uninitialized to indicate EOF
                return {};
            }
            QTC::TC("qpdf", "QPDFParser eof in parseRemainder");
            warn("unexpected EOF");
            return {QPDFObject::create<QPDF_Null>()};

        case QPDFTokenizer::tt_bad:
            QTC::TC("qpdf", "QPDFParser bad token in parseRemainder");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_brace_open:
        case QPDFTokenizer::tt_brace_close:
            QTC::TC("qpdf", "QPDFParser bad brace in parseRemainder");
            warn("treating unexpected brace token as null");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_array_close:
            if (bad_count && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state == st_array) {
                auto object = frame->null_count > 100
                    ? QPDFObject::create<QPDF_Array>(std::move(frame->olist), true)
                    : QPDFObject::create<QPDF_Array>(std::move(frame->olist));
                setDescription(object, frame->offset - 1);
                // The `offset` points to the next of "[".  Set the rewind offset to point to the
                // beginning of "[". This has been explicitly tested with whitespace surrounding the
                // array start delimiter. getLastOffset points to the array end token and therefore
                // can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad array close in parseRemainder");
                warn("treating unexpected array close token as null");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_dict_close:
            if (bad_count && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state <= st_dictionary_value) {
                // Attempt to recover more or less gracefully from invalid dictionaries.
                auto& dict = frame->dict;

                if (frame->state == st_dictionary_value) {
                    QTC::TC("qpdf", "QPDFParser no val for last key");
                    warn(
                        frame->offset,
                        "dictionary ended prematurely; using null as value for last key");
                    dict[frame->key] = QPDFObject::create<QPDF_Null>();
                }

                if (!frame->olist.empty()) {
                    fixMissingKeys();
                }

                if (!frame->contents_string.empty() && dict.count("/Type") &&
                    dict["/Type"].isNameAndEquals("/Sig") && dict.count("/ByteRange") &&
                    dict.count("/Contents") && dict["/Contents"].isString()) {
                    dict["/Contents"] = QPDFObjectHandle::newString(frame->contents_string);
                    dict["/Contents"].setParsedOffset(frame->contents_offset);
                }
                auto object = QPDFObject::create<QPDF_Dictionary>(std::move(dict));
                setDescription(object, frame->offset - 2);
                // The `offset` points to the next of "<<". Set the rewind offset to point to the
                // beginning of "<<". This has been explicitly tested with whitespace surrounding
                // the dictionary start delimiter. getLastOffset points to the dictionary end token
                // and therefore can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad dictionary close in parseRemainder");
                warn("unexpected dictionary close token");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_array_open:
        case QPDFTokenizer::tt_dict_open:
            if (stack.size() > 499) {
                QTC::TC("qpdf", "QPDFParser too deep");
                warn("ignoring excessively deeply nested data structure");
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                b_contents = false;
                stack.emplace_back(
                    input,
                    (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array
                                                                          : st_dictionary_key);
                frame = &stack.back();
                continue;
            }

        case QPDFTokenizer::tt_bool:
            addScalar<QPDF_Bool>(tokenizer.getValue() == "true");
            continue;

        case QPDFTokenizer::tt_null:
            addNull();
            continue;

        case QPDFTokenizer::tt_integer:
            if (!content_stream) {
                // Buffer token in case it is part of an indirect reference.
                last_offset_buffer[1] = input.getLastOffset();
                int_buffer[1] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                int_count = 1;
            } else {
                addScalar<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));
            }
            continue;

        case QPDFTokenizer::tt_real:
            addScalar<QPDF_Real>(tokenizer.getValue());
            continue;

        case QPDFTokenizer::tt_name:
            if (frame->state == st_dictionary_key) {
                frame->key = tokenizer.getValue();
                frame->state = st_dictionary_value;
                b_contents = decrypter && frame->key == "/Contents";
                continue;
            } else {
                addScalar<QPDF_Name>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_word:
            if (content_stream) {
                addScalar<QPDF_Operator>(tokenizer.getValue());
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string in parseRemainder");
                warn("unknown token while reading object; treating as string");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addScalar<QPDF_String>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_string:
            {
                auto const& val = tokenizer.getValue();
                if (decrypter) {
                    if (b_contents) {
                        frame->contents_string = val;
                        frame->contents_offset = input.getLastOffset();
                        b_contents = false;
                    }
                    std::string s{val};
                    decrypter->decryptString(s);
                    addScalar<QPDF_String>(s);
                } else {
                    addScalar<QPDF_String>(val);
                }
            }
            continue;

        default:
            warn("treating unknown token type as null while reading object");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
        }
    }
}